

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

JsErrorCode
WScriptJsrt::NotifyModuleReadyCallback(JsModuleRecord referencingModule,JsValueRef exceptionVar)

{
  LPCSTR pCVar1;
  mapped_type *pmVar2;
  ModuleMessage *message;
  ModuleMessage *moduleMessage;
  undefined1 local_48 [8];
  AutoString fileName;
  JsValueRef specifier;
  JsValueRef exceptionVar_local;
  JsModuleRecord referencingModule_local;
  
  exceptionVar_local = referencingModule;
  if ((exceptionVar != (JsValueRef)0x0) && (HostConfigFlags::flags.TraceHostCallbackIsEnabled)) {
    fileName.errorCode = JsNoError;
    fileName.dontFree = false;
    fileName._29_3_ = 0;
    ChakraRTInterface::JsGetModuleHostInfo
              (referencingModule,JsModuleHostInfo_Url,(void **)&fileName.errorCode);
    AutoString::AutoString((AutoString *)local_48);
    if (fileName._24_8_ != 0) {
      AutoString::Initialize((AutoString *)local_48,(JsValueRef)fileName._24_8_);
    }
    pCVar1 = AutoString::GetString((AutoString *)local_48);
    PAL_wprintf(L"NotifyModuleReadyCallback(exception) %S\n",pCVar1);
    AutoString::~AutoString((AutoString *)local_48);
  }
  pmVar2 = std::
           map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
           ::operator[](&moduleErrMap,&exceptionVar_local);
  if (*pmVar2 != ErroredModule) {
    message = ModuleMessage::Create(exceptionVar_local,(JsValueRef)0x0,(string *)0x0);
    if (message == (ModuleMessage *)0x0) {
      return JsErrorOutOfMemory;
    }
    PushMessage(&message->super_MessageBase);
  }
  return JsNoError;
}

Assistant:

JsErrorCode WScriptJsrt::NotifyModuleReadyCallback(_In_opt_ JsModuleRecord referencingModule, _In_opt_ JsValueRef exceptionVar)
{
    if (exceptionVar != nullptr && HostConfigFlags::flags.TraceHostCallbackIsEnabled)
    {
        JsValueRef specifier = JS_INVALID_REFERENCE;
        ChakraRTInterface::JsGetModuleHostInfo(referencingModule, JsModuleHostInfo_Url, &specifier);
        AutoString fileName;
        if (specifier != JS_INVALID_REFERENCE)
        {
            fileName.Initialize(specifier);
        }
        wprintf(_u("NotifyModuleReadyCallback(exception) %S\n"), fileName.GetString());
    }
    
    if (moduleErrMap[referencingModule] != ErroredModule)
    {
        WScriptJsrt::ModuleMessage* moduleMessage =
            WScriptJsrt::ModuleMessage::Create(referencingModule, nullptr);
        if (moduleMessage == nullptr)
        {
            return JsErrorOutOfMemory;
        }
        WScriptJsrt::PushMessage(moduleMessage);
    }
    return JsNoError;
}